

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::WriteConnection
          (cmGraphVizWriter *this,cmGeneratedFileStream *fs,cmLinkItem *depender,
          cmLinkItem *dependee,string *edgeStyle)

{
  string *__k;
  string *__k_00;
  ostream *poVar1;
  mapped_type *pmVar2;
  
  __k = cmLinkItem::AsStr_abi_cxx11_(depender);
  __k_00 = cmLinkItem::AsStr_abi_cxx11_(dependee);
  poVar1 = std::operator<<((ostream *)fs,"    \"");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  poVar1 = std::operator<<(poVar1,"\" -> \"");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k_00);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,(string *)edgeStyle);
  poVar1 = std::operator<<(poVar1," // ");
  poVar1 = std::operator<<(poVar1,(string *)__k);
  poVar1 = std::operator<<(poVar1," -> ");
  poVar1 = std::operator<<(poVar1,(string *)__k_00);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void cmGraphVizWriter::WriteConnection(cmGeneratedFileStream& fs,
                                       cmLinkItem const& depender,
                                       cmLinkItem const& dependee,
                                       std::string const& edgeStyle)
{
  auto const& dependerName = depender.AsStr();
  auto const& dependeeName = dependee.AsStr();

  fs << "    \"" << this->NodeNames[dependerName] << "\" -> \""
     << this->NodeNames[dependeeName] << "\" "
     << edgeStyle
     << " // " << dependerName << " -> " << dependeeName << '\n';
}